

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::basic_csv_cursor<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::
initialize_with_string_view
          (basic_csv_cursor<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *this,
          string_view_type sv)

{
  int iVar1;
  ser_error *this_00;
  type tVar2;
  error_code ec;
  error_code local_28;
  
  tVar2 = unicode_traits::detect_json_encoding<char>(sv._M_str,sv._M_len);
  if (utf8 < tVar2.encoding) {
    this_00 = (ser_error *)__cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::json_errc,void>(&local_28,illegal_unicode_character);
    ec._4_4_ = 0;
    ec._M_value = local_28._M_value;
    ec._M_cat = local_28._M_cat;
    ser_error::ser_error(this_00,ec,(this->parser_).line_,(this->parser_).column_);
    __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
  }
  (this->parser_).begin_input_ = tVar2.ptr;
  (this->parser_).input_end_ = sv._M_str + sv._M_len;
  (this->parser_).input_ptr_ = tVar2.ptr;
  iVar1 = (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(this);
  if ((char)iVar1 != '\0') {
    return;
  }
  (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(this);
  return;
}

Assistant:

void initialize_with_string_view(string_view_type sv)
    {
        auto r = unicode_traits::detect_json_encoding(sv.data(), sv.size());
        if (!(r.encoding == unicode_traits::encoding_kind::utf8 || r.encoding == unicode_traits::encoding_kind::undetected))
        {
            JSONCONS_THROW(ser_error(json_errc::illegal_unicode_character,parser_.line(),parser_.column()));
        }
        std::size_t offset = (r.ptr - sv.data());
        parser_.update(sv.data()+offset,sv.size()-offset);
        if (!done())
        {
            next();
        }
    }